

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O2

void __thiscall
pbrt::Transform::Decompose(Transform *this,Vector3f *T,SquareMatrix<4> *R,SquareMatrix<4> *S)

{
  float *pfVar1;
  float *pfVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  long lVar7;
  SquareMatrix<4> *pSVar8;
  uint uVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 local_148 [12];
  SquareMatrix<4> Rnext;
  SquareMatrix<4> local_f8;
  SquareMatrix<4> Rit;
  SquareMatrix<4> local_70;
  
  (T->super_Tuple3<pbrt::Vector3,_float>).x = (this->m).m[0][3];
  (T->super_Tuple3<pbrt::Vector3,_float>).y = (this->m).m[1][3];
  (T->super_Tuple3<pbrt::Vector3,_float>).z = (this->m).m[2][3];
  local_f8.m[0]._0_8_ = *(undefined8 *)(this->m).m[0];
  local_f8.m[0]._8_8_ = *(undefined8 *)((this->m).m[0] + 2);
  local_f8.m[1]._0_8_ = *(undefined8 *)(this->m).m[1];
  uVar3 = *(undefined8 *)((this->m).m[1] + 2);
  uVar4 = *(undefined8 *)((this->m).m[2] + 1);
  uVar5 = *(undefined8 *)((this->m).m[2] + 3);
  uVar6 = *(undefined8 *)((this->m).m[3] + 1);
  local_f8.m[2][0] = (Float)((ulong)*(undefined8 *)((this->m).m[1] + 3) >> 0x20);
  local_f8.m[2][1] = (Float)uVar4;
  local_f8.m[2][2] = (Float)((ulong)uVar4 >> 0x20);
  local_f8.m[2][3] = (Float)uVar5;
  local_f8.m[3][0] = (Float)((ulong)uVar5 >> 0x20);
  local_f8.m[3][1] = (Float)uVar6;
  local_f8.m[3][2] = (Float)((ulong)uVar6 >> 0x20);
  local_f8.m[1][2] = (Float)uVar3;
  local_f8.m[1][3] = (Float)((ulong)uVar3 >> 0x20);
  for (lVar7 = -0xc; lVar7 != 0; lVar7 = lVar7 + 4) {
    *(undefined4 *)((long)(Rit.m + -1) + 0xc + lVar7) = 0;
    *(undefined4 *)((long)(Rit.m + -1) + 0xc + lVar7 * 4) = 0;
  }
  local_f8.m[3][3] = 1.0;
  uVar9 = 0;
  *(undefined8 *)R->m[0] = local_f8.m[0]._0_8_;
  *(undefined8 *)(R->m[0] + 2) = local_f8.m[0]._8_8_;
  *(undefined8 *)R->m[1] = local_f8.m[1]._0_8_;
  *(ulong *)(R->m[1] + 2) = CONCAT44(local_f8.m[1][3],local_f8.m[1][2]);
  *(ulong *)R->m[2] = CONCAT44(local_f8.m[2][1],local_f8.m[2][0]);
  *(ulong *)(R->m[2] + 2) = CONCAT44(local_f8.m[2][3],local_f8.m[2][2]);
  *(ulong *)R->m[3] = CONCAT44(local_f8.m[3][1],local_f8.m[3][0]);
  *(ulong *)(R->m[3] + 2) = CONCAT44(0x3f800000,local_f8.m[3][2]);
  local_148._0_8_ = S;
  do {
    Transpose<4>(&local_70,R);
    Inverse<4>((optional<pbrt::SquareMatrix<4>_> *)&Rnext,&local_70);
    pSVar8 = pstd::optional<pbrt::SquareMatrix<4>_>::value
                       ((optional<pbrt::SquareMatrix<4>_> *)&Rnext);
    Rit.m[0]._0_8_ = *(undefined8 *)pSVar8->m[0];
    Rit.m[0]._8_8_ = *(undefined8 *)(pSVar8->m[0] + 2);
    Rit.m[1]._0_8_ = *(undefined8 *)pSVar8->m[1];
    Rit.m[1]._8_8_ = *(undefined8 *)(pSVar8->m[1] + 2);
    Rit.m[2]._0_8_ = *(undefined8 *)pSVar8->m[2];
    Rit.m[2]._8_8_ = *(undefined8 *)(pSVar8->m[2] + 2);
    Rit.m[3]._0_8_ = *(undefined8 *)pSVar8->m[3];
    Rit.m[3]._8_8_ = *(undefined8 *)(pSVar8->m[3] + 2);
    pstd::optional<pbrt::SquareMatrix<4>_>::~optional((optional<pbrt::SquareMatrix<4>_> *)&Rnext);
    SquareMatrix<4>::operator+(&local_70,R,&Rit);
    SquareMatrix<4>::operator/(&Rnext,&local_70,2.0);
    auVar13._8_4_ = 0x7fffffff;
    auVar13._0_8_ = 0x7fffffff7fffffff;
    auVar13._12_4_ = 0x7fffffff;
    auVar10 = ZEXT816(0) << 0x40;
    lVar7 = 8;
    while (lVar7 != 0x38) {
      auVar11._8_8_ = 0;
      auVar11._0_8_ = *(ulong *)((long)(R->m + -1) + 8 + lVar7);
      auVar12._8_8_ = 0;
      auVar12._0_8_ = *(ulong *)(local_148 + lVar7 + 4);
      auVar11 = vsubps_avx(auVar11,auVar12);
      pfVar1 = (float *)((long)R->m[0] + lVar7);
      pfVar2 = (float *)((long)Rnext.m[0] + lVar7);
      lVar7 = lVar7 + 0x10;
      auVar11 = vandps_avx(auVar11,auVar13);
      auVar12 = vhaddps_avx(auVar11,auVar11);
      auVar11 = vandps_avx(ZEXT416((uint)(*pfVar1 - *pfVar2)),auVar13);
      auVar10 = vmaxss_avx(ZEXT416((uint)(auVar12._0_4_ + auVar11._0_4_)),auVar10);
    }
    *(undefined8 *)R->m[0] = Rnext.m[0]._0_8_;
    *(undefined8 *)(R->m[0] + 2) = Rnext.m[0]._8_8_;
    *(undefined8 *)R->m[1] = Rnext.m[1]._0_8_;
    *(undefined8 *)(R->m[1] + 2) = Rnext.m[1]._8_8_;
    *(undefined8 *)R->m[2] = Rnext.m[2]._0_8_;
    *(undefined8 *)(R->m[2] + 2) = Rnext.m[2]._8_8_;
    *(undefined8 *)R->m[3] = Rnext.m[3]._0_8_;
    *(undefined8 *)(R->m[3] + 2) = Rnext.m[3]._8_8_;
  } while ((uVar9 < 99) && (uVar9 = uVar9 + 1, 0.0001 < auVar10._0_4_));
  Inverse<4>((optional<pbrt::SquareMatrix<4>_> *)&Rnext,R);
  pSVar8 = pstd::optional<pbrt::SquareMatrix<4>_>::value((optional<pbrt::SquareMatrix<4>_> *)&Rnext)
  ;
  pbrt::operator*(&Rit,pSVar8,&local_f8);
  *(undefined8 *)*(Float (*) [4])local_148._0_8_ = Rit.m[0]._0_8_;
  *(undefined8 *)(*(Float (*) [4])local_148._0_8_ + 2) = Rit.m[0]._8_8_;
  *(undefined8 *)((Float (*) [4])local_148._0_8_)[1] = Rit.m[1]._0_8_;
  *(undefined8 *)(((Float (*) [4])local_148._0_8_)[1] + 2) = Rit.m[1]._8_8_;
  *(undefined8 *)((Float (*) [4])local_148._0_8_)[2] = Rit.m[2]._0_8_;
  *(undefined8 *)(((Float (*) [4])local_148._0_8_)[2] + 2) = Rit.m[2]._8_8_;
  *(undefined8 *)((Float (*) [4])local_148._0_8_)[3] = Rit.m[3]._0_8_;
  *(undefined8 *)(((Float (*) [4])local_148._0_8_)[3] + 2) = Rit.m[3]._8_8_;
  pstd::optional<pbrt::SquareMatrix<4>_>::~optional((optional<pbrt::SquareMatrix<4>_> *)&Rnext);
  return;
}

Assistant:

void Transform::Decompose(Vector3f *T, SquareMatrix<4> *R, SquareMatrix<4> *S) const {
    // Extract translation _T_ from transformation matrix
    T->x = m[0][3];
    T->y = m[1][3];
    T->z = m[2][3];

    // Compute new transformation matrix _M_ without translation
    SquareMatrix<4> M = m;
    for (int i = 0; i < 3; ++i)
        M[i][3] = M[3][i] = 0.f;
    M[3][3] = 1.f;

    // Extract rotation _R_ from transformation matrix
    Float norm;
    int count = 0;
    *R = M;
    do {
        // Compute next matrix _Rnext_ in series
        SquareMatrix<4> Rit = *Inverse(Transpose(*R));
        SquareMatrix<4> Rnext = (*R + Rit) / 2;

        // Compute norm of difference between _R_ and _Rnext_
        norm = 0;
        for (int i = 0; i < 3; ++i) {
            Float n = std::abs((*R)[i][0] - Rnext[i][0]) +
                      std::abs((*R)[i][1] - Rnext[i][1]) +
                      std::abs((*R)[i][2] - Rnext[i][2]);
            norm = std::max(norm, n);
        }

        *R = Rnext;
    } while (++count < 100 && norm > .0001);
    // XXX TODO FIXME deal with flip...

    // Compute scale _S_ using rotation and original matrix
    *S = *Inverse(*R) * M;
}